

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_jp2_v2_t * jp2_create(opj_bool p_is_decoder)

{
  opj_j2k_v2_t *poVar1;
  opj_procedure_list_t *poVar2;
  int in_EDI;
  opj_jp2_v2_t *jp2;
  opj_jp2_v2_t *local_8;
  
  local_8 = (opj_jp2_v2_t *)malloc(0x98);
  if (local_8 != (opj_jp2_v2_t *)0x0) {
    memset(local_8,0,0x68);
    if (in_EDI == 0) {
      poVar1 = j2k_create_compress_v2();
      local_8->j2k = poVar1;
    }
    else {
      poVar1 = j2k_create_decompress_v2();
      local_8->j2k = poVar1;
    }
    if (local_8->j2k == (opj_j2k_v2 *)0x0) {
      jp2_destroy((opj_jp2_v2_t *)0x147c0f);
      local_8 = (opj_jp2_v2_t *)0x0;
    }
    else {
      (local_8->color).icc_profile_buf = (uchar *)0x0;
      (local_8->color).icc_profile_len = 0;
      (local_8->color).jp2_cdef = (opj_jp2_cdef_t *)0x0;
      (local_8->color).jp2_pclr = (opj_jp2_pclr_t *)0x0;
      (local_8->color).jp2_has_colr = '\0';
      poVar2 = opj_procedure_list_create();
      local_8->m_validation_list = poVar2;
      if (local_8->m_validation_list == (opj_procedure_list *)0x0) {
        jp2_destroy((opj_jp2_v2_t *)0x147c83);
        local_8 = (opj_jp2_v2_t *)0x0;
      }
      else {
        poVar2 = opj_procedure_list_create();
        local_8->m_procedure_list = poVar2;
        if (local_8->m_procedure_list == (opj_procedure_list *)0x0) {
          jp2_destroy((opj_jp2_v2_t *)0x147cb4);
          local_8 = (opj_jp2_v2_t *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

opj_jp2_v2_t* jp2_create(opj_bool p_is_decoder)
{
	opj_jp2_v2_t *jp2 = (opj_jp2_v2_t*)opj_malloc(sizeof(opj_jp2_v2_t));
	if (jp2) {
		memset(jp2,0,sizeof(opj_jp2_t));

		/* create the J2K codec */
		if (! p_is_decoder) {
			jp2->j2k = j2k_create_compress_v2();
		}
		else {
			jp2->j2k = j2k_create_decompress_v2();
		}

		if (jp2->j2k == 00) {
			jp2_destroy(jp2);
			return 00;
		}

		/* Color structure */
		jp2->color.icc_profile_buf = NULL;
		jp2->color.icc_profile_len = 0;
		jp2->color.jp2_cdef = NULL;
		jp2->color.jp2_pclr = NULL;
		jp2->color.jp2_has_colr = 0;

		/* validation list creation */
		jp2->m_validation_list = opj_procedure_list_create();
		if (! jp2->m_validation_list) {
			jp2_destroy(jp2);
			return 00;
		}

		/* execution list creation */
		jp2->m_procedure_list = opj_procedure_list_create();
		if (! jp2->m_procedure_list) {
			jp2_destroy(jp2);
			return 00;
		}
	}

	return jp2;
}